

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O1

void __thiscall
burst::
subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
::subset_iterator(subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
                  *this,int first,int last)

{
  __normal_iterator<boost::range_detail::integer_iterator<int>_*,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
  _Var1;
  allocator_type local_1a;
  undefined1 local_19;
  
  (this->m_begin).m_value = first;
  (this->m_end).m_value = last;
  std::
  vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>
  ::vector(&this->m_subset,-(long)(first - last),&local_1a);
  this->m_subset_size = 0;
  _Var1._M_current =
       (this->m_subset).
       super__Vector_base<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var1 = next_chain<__gnu_cxx::__normal_iterator<boost::range_detail::integer_iterator<int>*,std::vector<boost::range_detail::integer_iterator<int>,std::allocator<boost::range_detail::integer_iterator<int>>>>,boost::range_detail::integer_iterator<int>,burst::next_subset<__gnu_cxx::__normal_iterator<boost::range_detail::integer_iterator<int>*,std::vector<boost::range_detail::integer_iterator<int>,std::allocator<boost::range_detail::integer_iterator<int>>>>,boost::range_detail::integer_iterator<int>,std::less<void>>(__gnu_cxx::__normal_iterator<boost::range_detail::integer_iterator<int>*,std::vector<boost::range_detail::integer_iterator<int>,std::allocator<boost::range_detail::integer_iterator<int>>>>,__gnu_cxx::__normal_iterator<boost::range_detail::integer_iterator<int>*,std::vector<boost::range_detail::integer_iterator<int>,std::allocator<boost::range_detail::integer_iterator<int>>>>,boost::range_detail::integer_iterator<int>,boost::range_detail::integer_iterator<int>,std::less<void>)::_lambda(auto:1,auto:2,auto:3_const&)_1_>
                    (_Var1,_Var1,(integer_iterator<int>)(this->m_begin).m_value,
                     (integer_iterator<int>)(this->m_end).m_value,(less<void> *)&local_19);
  this->m_subset_size =
       (long)_Var1._M_current -
       (long)(this->m_subset).
             super__Vector_base<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 2;
  return;
}

Assistant:

explicit subset_iterator
            (
                ForwardIterator first, ForwardIterator last,
                compare_type compare = compare_type{}
            ):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_subset(static_cast<std::size_t>(std::distance(m_begin, m_end))),
            m_subset_size(0),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_begin, m_end, m_compare));
            increment();
        }